

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O2

bool __thiscall
AbstractModuleClient::sendClearStimulationParams(AbstractModuleClient *this,uint16_t slot)

{
  bool bVar1;
  TrodesMsg m;
  allocator local_59;
  string local_58;
  TrodesMsg local_38;
  
  TrodesMsg::TrodesMsg(&local_38);
  std::__cxx11::string::string((string *)&local_58,"s2",&local_59);
  TrodesMsg::addcontents<char_const*,unsigned_short>(&local_38,&local_58,"CLEAR",slot);
  std::__cxx11::string::~string((string *)&local_58);
  bVar1 = MlmWrap::sendHardwareMessage(&this->super_MlmWrap,&local_38);
  TrodesMsg::~TrodesMsg(&local_38);
  return bVar1;
}

Assistant:

bool AbstractModuleClient::sendClearStimulationParams(uint16_t slot){
    TrodesMsg m;
    m.addcontents("s2", "CLEAR", slot);
    return sendHardwareMessage(m);
}